

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

var * __thiscall cs::domain_type::get_var(domain_type *this,string *name)

{
  size_t sVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)this,name);
  if (sVar1 != 0) {
    puVar2 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                         *)this,name);
    return (this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           super__Vector_impl_data._M_start + *puVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::operator+(&bStack_58,"Use of undefined variable \"",name);
  std::operator+(&local_38,&bStack_58,"\".");
  runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var &get_var(const std::string &name)
		{
			if (m_reflect.count(name) > 0)
				return m_slot[m_reflect.at(name)];
			else
				throw runtime_error("Use of undefined variable \"" + name + "\".");
		}